

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O2

DatatypeValidator * __thiscall
xercesc_4_0::DatatypeValidatorFactory::createDatatypeValidator
          (DatatypeValidatorFactory *this,XMLCh *typeName,
          RefVectorOf<xercesc_4_0::DatatypeValidator> *validators,int finalSet,bool userDefined,
          MemoryManager *userManager)

{
  XMLSize_t XVar1;
  bool bVar2;
  UnionDatatypeValidator *this_00;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *this_01;
  DatatypeValidator *pDVar3;
  ValidatorType VVar4;
  ValidatorType VVar5;
  bool bVar6;
  bool bVar7;
  MemoryManager *manager;
  XMLSize_t i;
  XMLSize_t getAt;
  bool bVar8;
  bool bVar9;
  
  if (validators == (RefVectorOf<xercesc_4_0::DatatypeValidator> *)0x0) {
    this_00 = (UnionDatatypeValidator *)0x0;
  }
  else {
    manager = userManager;
    if (!userDefined) {
      manager = XMLPlatformUtils::fgMemoryManager;
    }
    this_00 = (UnionDatatypeValidator *)XMemory::operator_new(0x80,manager);
    UnionDatatypeValidator::UnionDatatypeValidator(this_00,validators,finalSet,manager);
    this_01 = fBuiltInRegistry;
    if ((userDefined) &&
       (this_01 = this->fUserDefinedRegistry,
       this->fUserDefinedRegistry ==
       (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0)) {
      this_01 = (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)
                XMemory::operator_new(0x38,userManager);
      RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::RefHashTableOf
                (this_01,0x1d,userManager);
      this->fUserDefinedRegistry = this_01;
    }
    RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
              (this_01,typeName,(DatatypeValidator *)this_00);
    DatatypeValidator::setTypeName((DatatypeValidator *)this_00,typeName);
    XVar1 = (validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>).fCurCount;
    if (XVar1 == 0) {
      (this_00->super_DatatypeValidator).fOrdered = ORDERED_PARTIAL;
      (this_00->super_DatatypeValidator).fBounded = true;
      (this_00->super_DatatypeValidator).fNumeric = true;
      bVar6 = true;
    }
    else {
      pDVar3 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                         (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,0);
      VVar4 = pDVar3->fType;
      if (pDVar3->fType - ID < 3) {
        VVar4 = String;
      }
      bVar8 = VVar4 != AnySimpleType;
      bVar9 = true;
      bVar7 = true;
      bVar2 = true;
      bVar6 = true;
      for (getAt = 0; XVar1 != getAt; getAt = getAt + 1) {
        if (bVar8) {
          pDVar3 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                             (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                              getAt);
          VVar5 = String;
          if (2 < pDVar3->fType - ID) {
            VVar5 = pDVar3->fType;
          }
          bVar8 = VVar4 == VVar5;
          if (bVar9) {
LAB_002edec9:
            pDVar3 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                               (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                                getAt);
            bVar9 = pDVar3->fOrdered == ORDERED_FALSE;
          }
        }
        else {
          if (bVar9) goto LAB_002edec9;
          if (((bVar7 == false) && (bVar2 == false)) && (bVar6 == false)) goto LAB_002edfb6;
        }
        if ((bVar7) &&
           (pDVar3 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                               (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                                getAt), pDVar3->fNumeric == false)) {
          bVar7 = false;
        }
        if (bVar2) {
          pDVar3 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                             (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                              getAt);
          if (pDVar3->fBounded == true) {
            pDVar3 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                               (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                                getAt);
            VVar5 = String;
            if (2 < pDVar3->fType - ID) {
              VVar5 = pDVar3->fType;
            }
            if (VVar4 == VVar5) goto LAB_002edf3e;
          }
          bVar2 = false;
        }
LAB_002edf3e:
        if ((bVar6) &&
           (pDVar3 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                               (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                                getAt), pDVar3->fFinite == false)) {
          bVar6 = false;
        }
      }
      if (bVar8) {
        pDVar3 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                           (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,0);
        (this_00->super_DatatypeValidator).fOrdered = pDVar3->fOrdered;
      }
      else {
LAB_002edfb6:
        if (bVar9) {
          (this_00->super_DatatypeValidator).fOrdered = ORDERED_FALSE;
        }
        else {
          (this_00->super_DatatypeValidator).fOrdered = ORDERED_PARTIAL;
        }
      }
      (this_00->super_DatatypeValidator).fNumeric = bVar7;
      (this_00->super_DatatypeValidator).fBounded = bVar2;
    }
    (this_00->super_DatatypeValidator).fFinite = bVar6;
  }
  return &this_00->super_DatatypeValidator;
}

Assistant:

DatatypeValidator* DatatypeValidatorFactory::createDatatypeValidator
(
      const XMLCh* const                    typeName
    , RefVectorOf<DatatypeValidator>* const validators
    , const int                             finalSet
    , const bool                            userDefined
    , MemoryManager* const                  userManager
)
{
    if (validators == 0)
        return 0;

    DatatypeValidator* datatypeValidator = 0;
    MemoryManager* const manager = (userDefined)
        ? userManager : XMLPlatformUtils::fgMemoryManager;

    datatypeValidator = new (manager) UnionDatatypeValidator(validators, finalSet, manager);

    if (datatypeValidator != 0) {

        if (userDefined) {

            if (!fUserDefinedRegistry) {
                fUserDefinedRegistry = new (userManager) RefHashTableOf<DatatypeValidator>(29, userManager);
            }

            fUserDefinedRegistry->put((void *)typeName, datatypeValidator);
        }
        else {
            fBuiltInRegistry->put((void *)typeName, datatypeValidator);
        }
        datatypeValidator->setTypeName(typeName);

        // Set PSVI information for Ordered, Numeric, Bounded & Finite
        XMLSize_t valSize = validators->size();
        if (valSize)
        {
            DatatypeValidator::ValidatorType ancestorId = getPrimitiveDV(validators->elementAt(0)->getType());

            // For a union the ORDERED {value} is partial unless one of the following:
            // 1. If every member of {member type definitions} is derived from a common ancestor other than the simple ur-type, then {value} is the same as that ancestor's ordered facet.
            // 2. If every member of {member type definitions} has a {value} of false for the ordered facet, then {value} is false.
            bool allOrderedFalse = true;
            bool commonAnc = ancestorId != DatatypeValidator::AnySimpleType;
            bool allNumeric = true;
            bool allBounded = true;
            bool allFinite  = true;

            for(XMLSize_t i = 0 ; (i < valSize) && (commonAnc || allOrderedFalse || allNumeric || allBounded || allFinite); i++)
            {
                // for the other member types, check whether the value is false
                // and whether they have the same ancestor as the first one
                if (commonAnc)
                    commonAnc = ancestorId == getPrimitiveDV(validators->elementAt(i)->getType());
                if (allOrderedFalse)
                    allOrderedFalse = validators->elementAt(i)->getOrdered() == XSSimpleTypeDefinition::ORDERED_FALSE;

                if (allNumeric && !validators->elementAt(i)->getNumeric())
                {
                    allNumeric = false;
                }
                if (allBounded && (!validators->elementAt(i)->getBounded() ||
                                   ancestorId != getPrimitiveDV(validators->elementAt(i)->getType())))
                {
                    allBounded = false;
                }
                if (allFinite && !validators->elementAt(i)->getFinite())
                {
                    allFinite = false;
                }
            }
            if (commonAnc)
            {
                datatypeValidator->setOrdered(validators->elementAt(0)->getOrdered());
            }
            else if (allOrderedFalse)
            {
                datatypeValidator->setOrdered(XSSimpleTypeDefinition::ORDERED_FALSE);
            }
            else
            {
                datatypeValidator->setOrdered(XSSimpleTypeDefinition::ORDERED_PARTIAL);
            }
            datatypeValidator->setNumeric(allNumeric);
            datatypeValidator->setBounded(allBounded);
            datatypeValidator->setFinite(allFinite);
        }
        else // size = 0
        {
            datatypeValidator->setOrdered(XSSimpleTypeDefinition::ORDERED_PARTIAL);
            datatypeValidator->setNumeric(true);
            datatypeValidator->setBounded(true);
            datatypeValidator->setFinite(true);
        }
    }
    return datatypeValidator;
}